

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

float glcts::SoftLight(float s,float d)

{
  float fVar1;
  float fVar2;
  
  if (s <= 0.5) {
    return d - (1.0 - (s + s)) * d * (1.0 - d);
  }
  fVar2 = s + s + -1.0;
  if (0.25 < d) {
    if (d < 0.0) {
      fVar1 = sqrtf(d);
    }
    else {
      fVar1 = SQRT(d);
    }
    return fVar2 * (fVar1 - d) + d;
  }
  return ((d * 16.0 + -12.0) * d + 3.0) * fVar2 * d + d;
}

Assistant:

static float SoftLight(float s, float d)
{
	if (s <= 0.5f)
		return d - (1.f - 2.f * s) * d * (1.f - d);
	else if (d <= 0.25f)
	{
		DE_ASSERT(s > 0.5f && d <= 0.25f);
		return d + (2.f * s - 1.f) * d * ((16.f * d - 12.f) * d + 3.f);
	}
	else
	{
		DE_ASSERT(s > 0.5f && d > 0.25f);
		return d + (2.f * s - 1.f) * (deFloatSqrt(d) - d);
	}
}